

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O3

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,NumeralExpression *expression)

{
  VariableValue *this_00;
  PrimitiveSimpleObject *this_01;
  Type *this_02;
  string local_50;
  
  this_00 = (VariableValue *)operator_new(0x50);
  this_01 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_02 = (Type *)operator_new(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"int","");
  Type::Type(this_02,&local_50);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_01,this_02);
  VariableValue::VariableValue(this_00,this_01,expression->value_);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(NumeralExpression* expression) {
  tos_value_ = new VariableValue(new PrimitiveSimpleObject(new Type("int")),
                                 expression->value_);
}